

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O1

Dec_Graph_t * Abc_ManResubDivs2(Abc_ManRes_t *p,int Required)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Dec_Graph_t *pDVar7;
  Abc_Obj_t *pObj2;
  long lVar8;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long local_68;
  
  pvVar3 = (p->pRoot->field_5).pData;
  lVar8 = (long)p->vDivs1UP->nSize;
  if (0 < lVar8) {
    uVar1 = p->vDivs2UP0->nSize;
    local_68 = 0;
    do {
      if (0 < (int)uVar1) {
        pObj0 = (Abc_Obj_t *)p->vDivs1UP->pArray[local_68];
        lVar4 = *(long *)(((ulong)pObj0 & 0xfffffffffffffffe) + 0x38);
        uVar2 = p->vDivs2UP1->nSize;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        uVar13 = 0;
        do {
          if (uVar13 == uVar2) goto LAB_00304c17;
          pObj1 = (Abc_Obj_t *)p->vDivs2UP0->pArray[uVar13];
          pObj2 = (Abc_Obj_t *)p->vDivs2UP1->pArray[uVar13];
          uVar9 = (uint)pObj1 & 1;
          lVar5 = *(long *)(((ulong)pObj1 & 0xfffffffffffffffe) + 0x38);
          lVar6 = *(long *)(((ulong)pObj2 & 0xfffffffffffffffe) + 0x38);
          if (((ulong)pObj0 & 1) == 0) {
            if ((uVar9 & (uint)pObj2) == 0) {
              if (((ulong)pObj1 & 1) == 0) {
                if (((ulong)pObj2 & 1) == 0) {
                  uVar9 = p->nWords;
                  if ((int)uVar9 < 1) {
LAB_00304892:
                    iVar10 = 0;
                    goto LAB_00304895;
                  }
                  uVar11 = 0;
                  do {
                    uVar12 = uVar11;
                    if ((p->pCareSet[uVar11] &
                        ((*(uint *)(lVar6 + uVar11 * 4) & *(uint *)(lVar5 + uVar11 * 4) |
                         *(uint *)(lVar4 + uVar11 * 4)) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) !=
                        0) break;
                    uVar11 = uVar11 + 1;
                    uVar12 = (ulong)uVar9;
                  } while (uVar9 != uVar11);
                }
                else {
                  uVar9 = p->nWords;
                  if ((int)uVar9 < 1) goto LAB_00304892;
                  uVar11 = 0;
                  do {
                    uVar12 = uVar11;
                    if ((p->pCareSet[uVar11] &
                        ((~*(uint *)(lVar6 + uVar11 * 4) & *(uint *)(lVar5 + uVar11 * 4) |
                         *(uint *)(lVar4 + uVar11 * 4)) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) !=
                        0) break;
                    uVar11 = uVar11 + 1;
                    uVar12 = (ulong)uVar9;
                  } while (uVar9 != uVar11);
                }
              }
              else {
                uVar9 = p->nWords;
                if ((int)uVar9 < 1) goto LAB_00304892;
                uVar11 = 0;
                do {
                  uVar12 = uVar11;
                  if ((p->pCareSet[uVar11] &
                      ((~*(uint *)(lVar5 + uVar11 * 4) & *(uint *)(lVar6 + uVar11 * 4) |
                       *(uint *)(lVar4 + uVar11 * 4)) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0)
                  break;
                  uVar11 = uVar11 + 1;
                  uVar12 = (ulong)uVar9;
                } while (uVar9 != uVar11);
              }
            }
            else {
              uVar9 = p->nWords;
              if ((int)uVar9 < 1) goto LAB_00304892;
              uVar11 = 0;
              do {
                uVar12 = uVar11;
                if ((p->pCareSet[uVar11] &
                    ((*(uint *)(lVar5 + uVar11 * 4) | *(uint *)(lVar4 + uVar11 * 4) |
                     *(uint *)(lVar6 + uVar11 * 4)) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0)
                break;
                uVar11 = uVar11 + 1;
                uVar12 = (ulong)uVar9;
              } while (uVar9 != uVar11);
            }
LAB_0030488c:
            iVar10 = (int)uVar12;
          }
          else {
            if ((uVar9 & (uint)pObj2) == 0) {
              if (((ulong)pObj1 & 1) == 0) {
                if (((ulong)pObj2 & 1) == 0) {
                  uVar9 = p->nWords;
                  if ((int)uVar9 < 1) goto LAB_00304892;
                  uVar11 = 0;
                  do {
                    uVar12 = uVar11;
                    if ((p->pCareSet[uVar11] &
                        ((*(uint *)(lVar6 + uVar11 * 4) & *(uint *)(lVar5 + uVar11 * 4) |
                         ~*(uint *)(lVar4 + uVar11 * 4)) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) !=
                        0) break;
                    uVar11 = uVar11 + 1;
                    uVar12 = (ulong)uVar9;
                  } while (uVar9 != uVar11);
                }
                else {
                  uVar9 = p->nWords;
                  if ((int)uVar9 < 1) goto LAB_00304892;
                  uVar11 = 0;
                  do {
                    uVar12 = uVar11;
                    if ((p->pCareSet[uVar11] &
                        ((~*(uint *)(lVar6 + uVar11 * 4) & *(uint *)(lVar5 + uVar11 * 4) |
                         ~*(uint *)(lVar4 + uVar11 * 4)) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) !=
                        0) break;
                    uVar11 = uVar11 + 1;
                    uVar12 = (ulong)uVar9;
                  } while (uVar9 != uVar11);
                }
              }
              else {
                uVar9 = p->nWords;
                if ((int)uVar9 < 1) goto LAB_00304892;
                uVar11 = 0;
                do {
                  uVar12 = uVar11;
                  if ((p->pCareSet[uVar11] &
                      ((~*(uint *)(lVar5 + uVar11 * 4) & *(uint *)(lVar6 + uVar11 * 4) |
                       ~*(uint *)(lVar4 + uVar11 * 4)) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0
                     ) break;
                  uVar11 = uVar11 + 1;
                  uVar12 = (ulong)uVar9;
                } while (uVar9 != uVar11);
              }
              goto LAB_0030488c;
            }
            uVar9 = p->nWords;
            if ((int)uVar9 < 1) goto LAB_00304892;
            uVar11 = 0;
            do {
              uVar12 = uVar11;
              if ((p->pCareSet[uVar11] &
                  ((~*(uint *)(lVar4 + uVar11 * 4) | *(uint *)(lVar5 + uVar11 * 4) |
                   *(uint *)(lVar6 + uVar11 * 4)) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0)
              break;
              uVar11 = uVar11 + 1;
              uVar12 = (ulong)uVar9;
            } while (uVar9 != uVar11);
            iVar10 = (int)uVar12;
          }
LAB_00304895:
          if (iVar10 == p->nWords) {
            p->nUsedNode2OrAnd = p->nUsedNode2OrAnd + 1;
            iVar10 = 1;
            goto LAB_00304c04;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar1);
      }
      local_68 = local_68 + 1;
    } while (local_68 != lVar8);
  }
  lVar8 = (long)p->vDivs1UN->nSize;
  if (0 < lVar8) {
    uVar1 = p->vDivs2UN0->nSize;
    local_68 = 0;
    do {
      if (0 < (int)uVar1) {
        pObj0 = (Abc_Obj_t *)p->vDivs1UN->pArray[local_68];
        lVar4 = *(long *)(((ulong)pObj0 & 0xfffffffffffffffe) + 0x38);
        uVar2 = p->vDivs2UN1->nSize;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        uVar13 = 0;
        do {
          if (uVar13 == uVar2) {
LAB_00304c17:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pObj1 = (Abc_Obj_t *)p->vDivs2UN0->pArray[uVar13];
          pObj2 = (Abc_Obj_t *)p->vDivs2UN1->pArray[uVar13];
          uVar9 = (uint)pObj1 & 1;
          lVar5 = *(long *)(((ulong)pObj1 & 0xfffffffffffffffe) + 0x38);
          lVar6 = *(long *)(((ulong)pObj2 & 0xfffffffffffffffe) + 0x38);
          if (((ulong)pObj0 & 1) == 0) {
            if ((uVar9 & (uint)pObj2) == 0) {
              if (((ulong)pObj1 & 1) == 0) {
                if (((ulong)pObj2 & 1) == 0) {
                  uVar9 = p->nWords;
                  if ((int)uVar9 < 1) goto LAB_00304ba5;
                  uVar11 = 0;
                  do {
                    uVar12 = uVar11;
                    if ((p->pCareSet[uVar11] &
                        (*(uint *)(lVar5 + uVar11 * 4) & *(uint *)(lVar4 + uVar11 * 4) &
                         *(uint *)(lVar6 + uVar11 * 4) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0
                       ) break;
                    uVar11 = uVar11 + 1;
                    uVar12 = (ulong)uVar9;
                  } while (uVar9 != uVar11);
                }
                else {
                  uVar9 = p->nWords;
                  if ((int)uVar9 < 1) goto LAB_00304ba5;
                  uVar11 = 0;
                  do {
                    uVar12 = uVar11;
                    if ((p->pCareSet[uVar11] &
                        (*(uint *)(lVar5 + uVar11 * 4) & *(uint *)(lVar4 + uVar11 * 4) &
                         ~*(uint *)(lVar6 + uVar11 * 4) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) !=
                        0) break;
                    uVar11 = uVar11 + 1;
                    uVar12 = (ulong)uVar9;
                  } while (uVar9 != uVar11);
                }
              }
              else {
                uVar9 = p->nWords;
                if ((int)uVar9 < 1) goto LAB_00304ba5;
                uVar11 = 0;
                do {
                  uVar12 = uVar11;
                  if ((p->pCareSet[uVar11] &
                      (~*(uint *)(lVar5 + uVar11 * 4) & *(uint *)(lVar4 + uVar11 * 4) &
                       *(uint *)(lVar6 + uVar11 * 4) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0)
                  break;
                  uVar11 = uVar11 + 1;
                  uVar12 = (ulong)uVar9;
                } while (uVar9 != uVar11);
              }
            }
            else {
              uVar9 = p->nWords;
              if ((int)uVar9 < 1) goto LAB_00304ba5;
              uVar11 = 0;
              do {
                uVar12 = uVar11;
                if ((p->pCareSet[uVar11] &
                    ((*(uint *)(lVar6 + uVar11 * 4) | *(uint *)(lVar5 + uVar11 * 4)) &
                     *(uint *)(lVar4 + uVar11 * 4) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0)
                break;
                uVar11 = uVar11 + 1;
                uVar12 = (ulong)uVar9;
              } while (uVar9 != uVar11);
            }
          }
          else if ((uVar9 & (uint)pObj2) == 0) {
            if (((ulong)pObj1 & 1) == 0) {
              if (((ulong)pObj2 & 1) == 0) {
                uVar9 = p->nWords;
                if ((int)uVar9 < 1) {
LAB_00304ba5:
                  uVar12 = 0;
                }
                else {
                  uVar11 = 0;
                  do {
                    uVar12 = uVar11;
                    if ((p->pCareSet[uVar11] &
                        (~*(uint *)(lVar4 + uVar11 * 4) & *(uint *)(lVar5 + uVar11 * 4) &
                         *(uint *)(lVar6 + uVar11 * 4) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0
                       ) break;
                    uVar11 = uVar11 + 1;
                    uVar12 = (ulong)uVar9;
                  } while (uVar9 != uVar11);
                }
              }
              else {
                uVar9 = p->nWords;
                if ((int)uVar9 < 1) goto LAB_00304ba5;
                uVar11 = 0;
                do {
                  uVar12 = uVar11;
                  if ((p->pCareSet[uVar11] &
                      (~(*(uint *)(lVar6 + uVar11 * 4) | *(uint *)(lVar4 + uVar11 * 4)) &
                       *(uint *)(lVar5 + uVar11 * 4) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0)
                  break;
                  uVar11 = uVar11 + 1;
                  uVar12 = (ulong)uVar9;
                } while (uVar9 != uVar11);
              }
            }
            else {
              uVar9 = p->nWords;
              if ((int)uVar9 < 1) goto LAB_00304ba5;
              uVar11 = 0;
              do {
                uVar12 = uVar11;
                if ((p->pCareSet[uVar11] &
                    (~(*(uint *)(lVar5 + uVar11 * 4) | *(uint *)(lVar4 + uVar11 * 4)) &
                     *(uint *)(lVar6 + uVar11 * 4) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0)
                break;
                uVar11 = uVar11 + 1;
                uVar12 = (ulong)uVar9;
              } while (uVar9 != uVar11);
            }
          }
          else {
            uVar9 = p->nWords;
            if ((int)uVar9 < 1) goto LAB_00304ba5;
            uVar11 = 0;
            do {
              uVar12 = uVar11;
              if ((p->pCareSet[uVar11] &
                  ((*(uint *)(lVar6 + uVar11 * 4) | *(uint *)(lVar5 + uVar11 * 4)) &
                   ~*(uint *)(lVar4 + uVar11 * 4) ^ *(uint *)((long)pvVar3 + uVar11 * 4))) != 0)
              break;
              uVar11 = uVar11 + 1;
              uVar12 = (ulong)uVar9;
            } while (uVar9 != uVar11);
          }
          if ((int)uVar12 == p->nWords) {
            p->nUsedNode2AndOr = p->nUsedNode2AndOr + 1;
            iVar10 = 0;
LAB_00304c04:
            pDVar7 = Abc_ManResubQuit2(p->pRoot,pObj0,pObj1,pObj2,iVar10);
            return pDVar7;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar1);
      }
      local_68 = local_68 + 1;
    } while (local_68 != lVar8);
  }
  return (Dec_Graph_t *)0x0;
}

Assistant:

Dec_Graph_t * Abc_ManResubDivs2( Abc_ManRes_t * p, int Required )
{
    Abc_Obj_t * pObj0, * pObj1, * pObj2;
    unsigned * puData0, * puData1, * puData2, * puDataR;
    int i, k, w;
    puDataR = (unsigned *)p->pRoot->pData;
    // check positive unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1UP, pObj0, i )
    {
        puData0 = (unsigned *)Abc_ObjRegular(pObj0)->pData;
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs2UP0, pObj1, k )
        {
            pObj2 = (Abc_Obj_t *)Vec_PtrEntry( p->vDivs2UP1, k );

            puData1 = (unsigned *)Abc_ObjRegular(pObj1)->pData;
            puData2 = (unsigned *)Abc_ObjRegular(pObj2)->pData;
            if ( Abc_ObjIsComplement(pObj0) )
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            else
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            if ( w == p->nWords )
            {
                p->nUsedNode2OrAnd++;
                return Abc_ManResubQuit2( p->pRoot, pObj0, pObj1, pObj2, 1 );
            }
        }
    }
    // check negative unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1UN, pObj0, i )
    {
        puData0 = (unsigned *)Abc_ObjRegular(pObj0)->pData;
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs2UN0, pObj1, k )
        {
            pObj2 = (Abc_Obj_t *)Vec_PtrEntry( p->vDivs2UN1, k );

            puData1 = (unsigned *)Abc_ObjRegular(pObj1)->pData;
            puData2 = (unsigned *)Abc_ObjRegular(pObj2)->pData;
            if ( Abc_ObjIsComplement(pObj0) )
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            else
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            if ( w == p->nWords )
            {
                p->nUsedNode2AndOr++;
                return Abc_ManResubQuit2( p->pRoot, pObj0, pObj1, pObj2, 0 );
            }
        }
    }
    return NULL;
}